

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# correction.hpp
# Opt level: O1

void MGARD::compute_load_vector_vertical<float>
               (float *load_v_buffer,float *nodal_buffer,float *coeff_buffer,size_t n1_nodal,
               size_t n1_coeff,size_t stride,float h,int batchsize)

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  float *pfVar4;
  float *pfVar5;
  ulong uVar6;
  size_t sVar7;
  float *pfVar8;
  float *pfVar9;
  
  uVar3 = (ulong)(uint)batchsize;
  if (0 < batchsize) {
    uVar6 = 0;
    do {
      load_v_buffer[uVar6] =
           nodal_buffer[stride + uVar6] * 0.083333336 +
           coeff_buffer[uVar6] * 0.5 + nodal_buffer[uVar6] * 0.8333333 * 0.5;
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  lVar1 = (long)batchsize;
  pfVar5 = load_v_buffer + lVar1;
  if (1 < n1_coeff) {
    pfVar4 = nodal_buffer + stride;
    pfVar8 = coeff_buffer + stride;
    pfVar9 = nodal_buffer + stride * 2;
    sVar7 = 1;
    do {
      if (0 < batchsize) {
        lVar2 = 0;
        do {
          *(float *)((long)pfVar5 + lVar2) =
               *(float *)((long)pfVar4 + lVar2) * 0.8333333 +
               (*(float *)((long)nodal_buffer + lVar2) + *(float *)((long)pfVar9 + lVar2)) *
               0.083333336 +
               (*(float *)((long)coeff_buffer + lVar2) + *(float *)((long)pfVar8 + lVar2)) * 0.5;
          lVar2 = lVar2 + 4;
        } while (uVar3 * 4 - lVar2 != 0);
      }
      nodal_buffer = nodal_buffer + stride;
      coeff_buffer = coeff_buffer + stride;
      sVar7 = sVar7 + 1;
      pfVar5 = pfVar5 + lVar1;
      pfVar8 = pfVar8 + stride;
      pfVar4 = pfVar4 + stride;
      pfVar9 = pfVar9 + stride;
    } while (sVar7 != n1_coeff);
  }
  if (0 < batchsize) {
    uVar6 = 0;
    do {
      pfVar5[uVar6] =
           nodal_buffer[stride + uVar6] * 0.8333333 * 0.5 +
           nodal_buffer[uVar6] * 0.083333336 + coeff_buffer[uVar6] * 0.5;
      uVar6 = uVar6 + 1;
    } while (uVar3 != uVar6);
  }
  if (n1_coeff + 2 == n1_nodal && 0 < batchsize) {
    memset(pfVar5 + lVar1,0,uVar3 << 2);
    return;
  }
  return;
}

Assistant:

void compute_load_vector_vertical(T * load_v_buffer, const T * nodal_buffer, const T * coeff_buffer, size_t n1_nodal, size_t n1_coeff, size_t stride, T h, int batchsize){
    // T ah = h * 0.25; // derived constant in the formula
    // T ah = alpha * h;   // 1/12
    // T bh = beta * h;    // 1/2
    // T ch = gamma * h;   // 5/6
    // eliminate h for efficiency
    T ah = alpha;   // 1/12
    T bh = beta;    // 1/2
    T ch = gamma;   // 5/6
    T const * nodal_pos = nodal_buffer;
    T const * coeff_pos = coeff_buffer;
    T * load_v_pos = load_v_buffer;
    // first nodal value
    for(int j=0; j<batchsize; j++){
        // load_v_pos[j] = coeff_pos[j] * ah;
        load_v_pos[j] = nodal_pos[j] * ch / 2 + coeff_pos[j] * bh + nodal_pos[stride + j] * ah;
    }
    load_v_pos += batchsize;
    nodal_pos += stride;
    coeff_pos += stride;
    for(int i=1; i<n1_coeff; i++){
        for(int j=0; j<batchsize; j++){
            // load_v_pos[j] = (coeff_pos[-stride + j] + coeff_pos[j]) * ah;
            load_v_pos[j] = (nodal_pos[j - stride] + nodal_pos[j + stride]) * ah + (coeff_pos[j - stride] + coeff_pos[j]) * bh + nodal_pos[j] * ch;
        }
        load_v_pos += batchsize;
        nodal_pos += stride;
        coeff_pos += stride;
    }
    // last nodal value
    for(int j=0; j<batchsize; j++){
        // load_v_pos[j] = coeff_pos[-stride + j] * ah;
        load_v_pos[j] = nodal_pos[j - stride] * ah + coeff_pos[j - stride] * bh + nodal_pos[j] * ch / 2;
    }
    // if next n is even, load_v_buffer[n_nodal - 1] = 0
    if(n1_nodal == n1_coeff + 2){
        load_v_pos += batchsize;
        for(int j=0; j<batchsize; j++){
            load_v_pos[j] = 0;
        }
    }
}